

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blif_parser.cpp
# Opt level: O2

void __thiscall BFunction::~BFunction(BFunction *this)

{
  std::vector<Terms,_std::allocator<Terms>_>::~vector(&this->_inputs);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

BFunction(string output) {
    this->_output = output;
  }